

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_lnx_ModuleEnumerator.cpp
# Opt level: O2

bool __thiscall
axl::sys::lnx::EnumeratorModulesParser::processModule
          (EnumeratorModulesParser *this,StringRef *name,size_t size,size_t useCount,
          ModuleState state,size_t offset)

{
  ModuleDesc *p;
  EVP_PKEY_CTX *src;
  
  p = (ModuleDesc *)operator_new(0x50);
  (p->m_name).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p = (C *)0x0;
  (p->m_name).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr = (BufHdr *)0x0;
  *(undefined8 *)
   ((long)&(p->m_name).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr + 1) = 0;
  *(undefined8 *)
   ((long)&(p->m_name).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length + 1) =
       0;
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy(&p->m_name,(EVP_PKEY_CTX *)name,src)
  ;
  p->m_size = size;
  p->m_useCount = useCount;
  p->m_state = state;
  p->m_offset = offset;
  sl::
  ListBase<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>_>_>
  ::insertTail((ListBase<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>_>_>
                *)this->m_moduleList,p);
  return true;
}

Assistant:

bool
	processModule(
		const sl::StringRef& name,
		size_t size,
		size_t useCount,
		ModuleState state,
		size_t offset
	) {
		ModuleDesc* moduleDesc = new ModuleDesc;
		moduleDesc->m_name = name;
		moduleDesc->m_size = size;
		moduleDesc->m_useCount = useCount;
		moduleDesc->m_state = state;
		moduleDesc->m_offset = offset;
		m_moduleList->insertTail(moduleDesc);
		return true;
	}